

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O1

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CMethod *stm)

{
  bool _isPublic;
  element_type *peVar1;
  CIdExp *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  CType *pCVar4;
  CArgumentList *pCVar5;
  element_type *peVar6;
  CFieldList *pCVar7;
  CCompoundStm *pCVar8;
  IExpression *pIVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  MethodInfo *this_00;
  VariablesInfo *pVVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<TypeInfo> local_38;
  
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar1->iName,0,(char *)(peVar1->iName)._M_string_length,0x15c41a);
  pCVar2 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var3 = (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pCVar4 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  this_00 = (MethodInfo *)operator_new(0x58);
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _isPublic = stm->isPublic;
  local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  MethodInfo::MethodInfo(this_00,&peVar1->iName,_isPublic,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<MethodInfo*>(&_Stack_40,this_00);
  _Var10._M_pi = _Stack_40._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (peVar1->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  (peVar1->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  if (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pVVar11 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar11);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VariablesInfo*>
            (&_Stack_40,pVVar11);
  _Var10._M_pi = _Stack_40._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pVVar11;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var10._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  pCVar5 = (stm->arguments)._M_t.
           super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
           super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
           super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  if (pCVar5 != (CArgumentList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar5->super_IWrapper).super_PositionedNode)(pCVar5,this);
  }
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6 = (peVar1->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar6->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar6->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->definedVariables).
              super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pVVar11 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar11);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VariablesInfo*>
            (&_Stack_40,pVVar11);
  _Var10._M_pi = _Stack_40._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pVVar11;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var10._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  pCVar7 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar7 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar7->super_IWrapper).super_PositionedNode)(pCVar7,this);
  }
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6 = (peVar1->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar6->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar6->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pCVar8 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  if (pCVar8 != (CCompoundStm *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar8->super_IStatement).super_PositionedNode)(pCVar8,this);
  }
  pIVar9 = (stm->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar9 != (IExpression *)0x0) {
    (*(code *)*(pIVar9->super_PositionedNode).super_INode._vptr_INode)(pIVar9,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CMethod &stm )
{
//	std::cout << "method\n";
	info->iName = "";
	stm.name->Accept( *this );

	info->iType = nullptr;
	stm.returnType->Accept( *this );

	info->iMethod = std::shared_ptr<MethodInfo>( new MethodInfo( info->iName, stm.isPublic, info->iType ) );

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.arguments ) {
		stm.arguments->Accept( *this );
	}
    info->iMethod->arguments = info->iVariables;
    info->definedVariables = info->iVariables;
    info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.vars ) {
		stm.vars->Accept( *this );
	}
	info->iMethod->fields = info->iVariables;

	if( stm.statements ) {
		stm.statements->Accept( *this );
	}
	if( stm.returnExp ) {
		stm.returnExp->Accept( *this );
	}
}